

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall
CGL::RaytracedRenderer::save_sampling_rate_image(RaytracedRenderer *this,string *filename)

{
  size_t w;
  size_t h;
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  uchar *in;
  size_t i;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t y;
  size_t x;
  float fVar7;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ImageBuffer outputBuffer;
  
  w = (this->frameBuffer).w;
  h = (this->frameBuffer).h;
  ImageBuffer::ImageBuffer(&outputBuffer,w,h);
  lVar6 = 0;
  for (x = 0; lVar5 = lVar6, y = h, x != w; x = x + 1) {
    while (y = y - 1, y != 0xffffffffffffffff) {
      fVar7 = (float)*(int *)(*(long *)(this->pt + 0xd8) + lVar5) /
              (float)*(ulong *)(this->pt + 0x40);
      if (fVar7 <= 0.5) {
        fVar3 = (0.5 - fVar7) + (0.5 - fVar7);
        local_98._8_4_ = (1.0 - fVar3) * 0.0;
        fVar7 = fVar3 * 0.0 + (float)local_98._8_4_;
        fVar1 = fVar3 * 0.0 + (1.0 - fVar3);
        local_98._8_4_ = (float)local_98._8_4_ + fVar3;
      }
      else {
        fVar3 = (1.0 - fVar7) + (1.0 - fVar7);
        local_98._8_4_ = (1.0 - fVar3) * 0.0;
        fVar7 = fVar3 * 0.0 + (1.0 - fVar3);
        fVar1 = (float)local_98._8_4_ + fVar3;
        local_98._8_4_ = fVar3 * 0.0 + (float)local_98._8_4_;
      }
      auVar2 = vinsertps_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar1),0x10);
      local_98._0_8_ = vmovlps_avx(auVar2);
      ImageBuffer::update_pixel(&outputBuffer,(Color *)local_98,x,y);
      lVar5 = lVar5 + w * 4;
    }
    lVar6 = lVar6 + 4;
  }
  uVar4 = h * w;
  in = (uchar *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
  for (lVar6 = 0; uVar4 - lVar6 != 0; lVar6 = lVar6 + 1) {
    *(uint *)(in + lVar6 * 4) =
         outputBuffer.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar6] | 0xff000000;
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_78,"_rate.png");
  lodepng::encode((string *)local_98,in,(uint)w,(uint)h,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_78);
  operator_delete__(in);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputBuffer.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void RaytracedRenderer::save_sampling_rate_image(string filename) {
  size_t w = frameBuffer.w;
  size_t h = frameBuffer.h;
  ImageBuffer outputBuffer(w, h);

  for (int x = 0; x < w; x++) {
      for (int y = 0; y < h; y++) {
          float samplingRate = pt->sampleCountBuffer[y * w + x] * 1.0f / pt->ns_aa;

          Color c;
          if (samplingRate <= 0.5) {
              float r = (0.5 - samplingRate) / 0.5;
              c = Color(0.0f, 0.0f, 1.0f) * r + Color(0.0f, 1.0f, 0.0f) * (1.0 - r);
          } else {
              float r = (1.0 - samplingRate) / 0.5;
              c = Color(0.0f, 1.0f, 0.0f) * r + Color(1.0f, 0.0f, 0.0f) * (1.0 - r);
          }
          outputBuffer.update_pixel(c, x, h - 1 - y);
      }
  }
  uint32_t* frame_out = new uint32_t[w * h];
  
  for (size_t i = 0; i < w * h; ++i) {
    uint32_t out_color_hex = 0;
    frame_out[i] = outputBuffer.data.data()[i];
    frame_out[i] |= 0xFF000000;
  }

  lodepng::encode(filename.substr(0,filename.size()-4) + "_rate.png", (unsigned char*) frame_out, w, h);
  
  delete[] frame_out;
}